

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

bool __thiscall
duckdb::ART::ConstructInternal
          (ART *this,unsafe_vector<ARTKey> *keys,unsafe_vector<ARTKey> *row_ids,Node *node,
          ARTKeySection *section)

{
  ARTKey *key;
  idx_t iVar1;
  idx_t iVar2;
  pointer pAVar3;
  idx_t depth;
  idx_t iVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  idx_t iVar7;
  pointer pAVar8;
  reference<Node> node_00;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  NType type;
  ulong uVar12;
  idx_t iVar13;
  ARTKeySection *child;
  pointer section_00;
  unsafe_vector<ARTKeySection> children;
  Node new_child;
  reference<Node> ref;
  unsafe_vector<ARTKeySection> local_68;
  pointer local_50;
  IndexPointer local_48;
  ARTKey *local_40;
  reference<Node> local_38;
  
  iVar1 = section->start;
  iVar2 = section->end;
  pAVar3 = (keys->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
           super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
           super__Vector_impl_data._M_start;
  key = pAVar3 + iVar1;
  depth = section->depth;
  iVar4 = pAVar3[iVar1].len;
  local_50 = (pointer)node;
  if (iVar4 != depth) {
    pdVar5 = key->data;
    pdVar6 = pAVar3[iVar2].data;
    iVar7 = depth;
    do {
      iVar13 = iVar7 + 1;
      if (pdVar5[iVar7] != pdVar6[iVar7]) {
        local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
        super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
        super__Vector_impl_data._M_start = (ARTKeySection *)0x0;
        local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
        super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
        super__Vector_impl_data._M_finish = (ARTKeySection *)0x0;
        local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
        super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ARTKeySection::GetChildSections(section,&local_68,keys);
        local_38._M_data = (Node *)local_50;
        Prefix::New(this,&local_38,key,depth,section->depth - depth);
        node_00._M_data = local_38._M_data;
        uVar11 = (long)local_68.
                       super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                       super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_68.
                       super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                       super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        type = NODE_4;
        if ((4 < uVar11) && (type = NODE_16, 0x10 < uVar11)) {
          type = NODE_256 - (uVar11 < 0x31);
        }
        Node::New(this,local_38._M_data,type);
        pAVar8 = local_68.
                 super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                 super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        section_00 = local_68.
                     super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                     super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        if (local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
            super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
            super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          bVar9 = true;
        }
        else {
          do {
            local_48.data = 0;
            bVar9 = ConstructInternal(this,keys,row_ids,(Node *)&local_48,section_00);
            Node::InsertChild(this,node_00._M_data,section_00->key_byte,(Node)local_48.data);
            section_00 = section_00 + 1;
          } while (bVar9 && section_00 != pAVar8);
        }
        if (local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
            super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
            _M_impl.super__Vector_impl_data._M_start == (ARTKeySection *)0x0) {
          return bVar9;
        }
        operator_delete(local_68.
                        super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
                        super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        return bVar9;
      }
      section->depth = iVar13;
      iVar7 = iVar13;
    } while (iVar13 != iVar4);
  }
  local_40 = key;
  iVar10 = (*(this->super_BoundIndex).super_Index._vptr_Index[5])(this);
  if ((byte)((char)iVar10 - 1U) < 2 && iVar2 - iVar1 != 0) {
    bVar9 = false;
  }
  else {
    local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
    super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
    super__Vector_impl_data._M_start = local_50;
    Prefix::New(this,(reference<Node> *)&local_68,local_40,depth,
                (ulong)((int)local_40->len - (int)depth & 0xff));
    if (iVar2 == iVar1) {
      uVar11 = *(ulong *)(row_ids->super_vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>).
                         super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl
                         .super__Vector_impl_data._M_start[section->start].data;
      uVar12 = uVar11 & 0xfffffffffffffff8 ^ 0x87;
      ((IndexPointer *)
      &(local_68.super_vector<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>.
        super__Vector_base<duckdb::ARTKeySection,_std::allocator<duckdb::ARTKeySection>_>._M_impl.
        super__Vector_impl_data._M_start)->start)->data =
           uVar11 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18
           | (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18
           | (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
    }
    else {
      Leaf::New(this,(reference<Node> *)&local_68,row_ids,section->start,(iVar2 - iVar1) + 1);
    }
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool ART::ConstructInternal(const unsafe_vector<ARTKey> &keys, const unsafe_vector<ARTKey> &row_ids, Node &node,
                            ARTKeySection &section) {
	D_ASSERT(section.start < keys.size());
	D_ASSERT(section.end < keys.size());
	D_ASSERT(section.start <= section.end);

	auto &start = keys[section.start];
	auto &end = keys[section.end];
	D_ASSERT(start.len != 0);

	// Increment the depth until we reach a leaf or find a mismatching byte.
	auto prefix_depth = section.depth;
	while (start.len != section.depth && start.ByteMatches(end, section.depth)) {
		section.depth++;
	}

	if (start.len == section.depth) {
		// We reached a leaf. All the bytes of start_key and end_key match.
		auto row_id_count = section.end - section.start + 1;
		if (IsUnique() && row_id_count != 1) {
			return false;
		}

		reference<Node> ref(node);
		auto count = UnsafeNumericCast<uint8_t>(start.len - prefix_depth);
		Prefix::New(*this, ref, start, prefix_depth, count);
		if (row_id_count == 1) {
			Leaf::New(ref, row_ids[section.start].GetRowId());
		} else {
			Leaf::New(*this, ref, row_ids, section.start, row_id_count);
		}
		return true;
	}

	// Create a new node and recurse.
	unsafe_vector<ARTKeySection> children;
	section.GetChildSections(children, keys);

	// Create the prefix.
	reference<Node> ref(node);
	auto prefix_length = section.depth - prefix_depth;
	Prefix::New(*this, ref, start, prefix_depth, prefix_length);

	// Create the node.
	Node::New(*this, ref, Node::GetNodeType(children.size()));
	for (auto &child : children) {
		Node new_child;
		auto success = ConstructInternal(keys, row_ids, new_child, child);
		Node::InsertChild(*this, ref, child.key_byte, new_child);
		if (!success) {
			return false;
		}
	}
	return true;
}